

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

Vec_Ptr_t * Abc_CutFactor(Abc_Obj_t *pNode)

{
  uint *puVar1;
  uint uVar2;
  Vec_Ptr_t *vLeaves;
  void **ppvVar3;
  long lVar4;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar2 != 5) && (uVar2 != 2)) {
    vLeaves = (Vec_Ptr_t *)malloc(0x10);
    vLeaves->nCap = 10;
    vLeaves->nSize = 0;
    ppvVar3 = (void **)malloc(0x50);
    vLeaves->pArray = ppvVar3;
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves);
    Abc_CutFactor_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vLeaves);
    if (0 < vLeaves->nSize) {
      lVar4 = 0;
      do {
        puVar1 = (uint *)((long)vLeaves->pArray[lVar4] + 0x14);
        *puVar1 = *puVar1 & 0xffffffef;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vLeaves->nSize);
    }
    return vLeaves;
  }
  __assert_fail("!Abc_ObjIsCi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x819,"Vec_Ptr_t *Abc_CutFactor(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Abc_CutFactor( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_ObjIsCi(pNode) );
    vLeaves  = Vec_PtrAlloc( 10 );
    Abc_CutFactor_rec( Abc_ObjFanin0(pNode), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pNode), vLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkA = 0;
    return vLeaves;
}